

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AV1QuantizeTest_EobVerify_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1QuantizeTest_EobVerify_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<(anonymous_namespace)::QuantizeFuncParams>::SetParam((ParamType *)(in_RDI + 8))
  ;
  this_00 = (Test *)operator_new(0x30);
  anon_unknown.dwarf_2256c::AV1QuantizeTest_EobVerify_Test::AV1QuantizeTest_EobVerify_Test
            ((AV1QuantizeTest_EobVerify_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }